

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

int32_t __thiscall Bitmap::getPixelIndex(Bitmap *this,int32_t x,int32_t y)

{
  int32_t y_local;
  int32_t x_local;
  Bitmap *this_local;
  
  if (this->orientation == Horizontally) {
    if ((uint)x < this->width) {
      if ((uint)y < this->height) {
        this_local._4_4_ = y * this->width + x;
      }
      else {
        this_local._4_4_ = -1;
      }
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  else if ((uint)y < this->width) {
    if ((uint)x < this->height) {
      this_local._4_4_ = ((this->width - 1) - y) + x * this->width;
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t Bitmap::getPixelIndex(const int32_t x, const int32_t y)
{
   if (orientation == Orientation::Horizontally)
   {
      //check for label under- and overflow
      if ((uint32_t)x >= this->width) return -1;
      if ((uint32_t)y >= this->height) return -1;
      //otherwise
      return (y * this->width) + x;
   }
   else //Vertically
   {
      //check for label under- and overflow
      if ((uint32_t)y >= this->width) return -1;
      if ((uint32_t)x >= this->height) return -1;
      //otherwise
      return ((this->width - 1) - y) + (x * this->width);
   }
}